

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O3

int32_t get_gpr_store_offset_as_int(Instruction *instr)

{
  int32_t iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (instr->kind == *(InstructionKind *)((long)&_ZGRN12_GLOBAL__N_110gpr_storesE_ + lVar2)) {
      if (instr->n_src == '\x03') {
        iVar1 = InstructionAtom::get_imm(instr->src + 1);
        return iVar1;
      }
      __assert_fail("instr.n_src == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                    ,0x108,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  __assert_fail("is_gpr_store(instr)",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                ,0x107,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
}

Assistant:

int32_t get_gpr_store_offset_as_int(const Instruction& instr) {
  assert(is_gpr_store(instr));
  assert(instr.n_src == 3);
  return instr.src[1].get_imm();
}